

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

Point3f * phyr::offsetRayOrigin
                    (Point3f *__return_storage_ptr__,Point3f *p,Normal3f *n,Vector3f *w,
                    Vector3f *fpError)

{
  double dVar1;
  int i;
  int iVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double local_58 [4];
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  
  local_58[1] = n->y;
  dStack_20 = ABS(local_58[1]);
  local_58[2] = (ABS(n->x) * fpError->x + ABS(local_58[1]) * fpError->y + ABS(n->z) * fpError->z) *
                1024.0;
  local_58[0] = local_58[2] * n->x;
  local_58[1] = local_58[2] * local_58[1];
  local_58[2] = local_58[2] * n->z;
  local_38 = local_58[0];
  dStack_30 = local_58[1];
  local_28 = local_58[2];
  dVar5 = dot<double>(w,n);
  if (dVar5 < 0.0) {
    local_38 = -local_38;
    dStack_30 = -dStack_30;
    local_28 = -local_28;
    local_58[0] = local_38;
    local_58[1] = dStack_30;
    local_58[2] = local_28;
  }
  dVar5 = p->z;
  dVar1 = p->y;
  __return_storage_ptr__->x = p->x + local_38;
  __return_storage_ptr__->y = dVar1 + dStack_30;
  __return_storage_ptr__->z = local_28 + dVar5;
  iVar2 = 0;
  do {
    if (iVar2 == 3) {
      return __return_storage_ptr__;
    }
    lVar3 = 0;
    if (iVar2 != 0) {
      lVar3 = (ulong)(iVar2 != 1) * 8 + 8;
    }
    if (*(double *)((long)local_58 + lVar3) <= 0.0) {
      if (*(double *)((long)local_58 + lVar3) < 0.0) {
        dVar5 = *(double *)((long)&__return_storage_ptr__->x + lVar3);
        lVar4 = -0x10000000000000;
        if (-INFINITY < dVar5) {
          dVar5 = (double)(~-(ulong)(dVar5 == 0.0) & (ulong)dVar5 |
                          -(ulong)(dVar5 == 0.0) & 0x8000000000000000);
          lVar4 = (long)dVar5 + (ulong)(dVar5 <= 0.0) * 2 + -1;
        }
        goto LAB_0010785f;
      }
    }
    else {
      dVar5 = *(double *)((long)&__return_storage_ptr__->x + lVar3);
      lVar4 = 0x7ff0000000000000;
      if (dVar5 < INFINITY) {
        dVar5 = (double)(~-(ulong)(dVar5 == 0.0) & (ulong)dVar5);
        lVar4 = (-(ulong)(dVar5 < 0.0) | 1) + (long)dVar5;
      }
LAB_0010785f:
      *(long *)((long)&__return_storage_ptr__->x + lVar3) = lVar4;
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

inline Point3f offsetRayOrigin(const Point3f& p, const Normal3f& n,
                               const Vector3f& w, const Vector3f& fpError) {
    Real d = dot(abs(n), fpError);
#ifdef PHYRAY_USE_LONG_P
    d *= 1024;  // Use higher ulps factor for double
#endif

    Vector3f offset = Vector3f(n) * d;
    if (dot(w, n) < 0) offset = -offset;
    Point3f op = p + offset;

    // Round indiviual components up or down depending on the sign
    for (int i = 0; i < 3; i++) {
        if (offset[i] > 0) op[i] = nextFloatUp(op[i]);
        else if (offset[i] < 0) op[i] = nextFloatDown(op[i]);
    }

    return op;
}